

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi.c
# Opt level: O0

int lws_wsi_txc_report_manual_txcr_in(lws *wsi,int32_t bump)

{
  int32_t bump_local;
  lws *wsi_local;
  
  if ((wsi->txc).manual == '\0') {
    wsi_local._4_4_ = 0;
  }
  else {
    wsi_local._4_4_ =
         user_callback_handle_rxflow
                   (wsi->protocol->callback,wsi,LWS_CALLBACK_WSI_TX_CREDIT_GET,wsi->user_space,
                    (void *)0x0,(long)bump);
  }
  return wsi_local._4_4_;
}

Assistant:

int
lws_wsi_txc_report_manual_txcr_in(struct lws *wsi, int32_t bump)
{
	if (!wsi->txc.manual)
		/*
		 * If we don't care about managing it manually, no need to
		 * report it
		 */
		return 0;

	return user_callback_handle_rxflow(wsi->protocol->callback,
					   wsi, LWS_CALLBACK_WSI_TX_CREDIT_GET,
					   wsi->user_space, NULL, (size_t)bump);
}